

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall cs_impl::any::any<cs::lang_error>(any *this,lang_error *dat)

{
  proxy *ppVar1;
  int local_1c;
  holder<cs::lang_error> *local_18;
  
  local_1c = 1;
  local_18 = cs::
             allocator_type<cs_impl::any::holder<cs::lang_error>,64ul,cs_impl::default_allocator_provider>
             ::alloc<cs::lang_error_const&>
                       ((allocator_type<cs_impl::any::holder<cs::lang_error>,64ul,cs_impl::default_allocator_provider>
                         *)holder<cs::lang_error>::allocator,dat);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,cs_impl::any::holder<cs::lang_error>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_1c,&local_18);
  this->mDat = ppVar1;
  return;
}

Assistant:

any(const T &dat):mDat(allocator.alloc(1, holder<T>::allocator.alloc(dat))) {}